

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

bool __thiscall
ON_DimStyle::Internal_SetColorMember
          (ON_DimStyle *this,field field_id,ON_Color value,ON_Color *class_member)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_2c;
  
  local_2c = value.field_0;
  uVar2 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_2c);
  uVar3 = ON_Color::operator_cast_to_unsigned_int(class_member);
  if (uVar2 != uVar3) {
    class_member->field_0 = local_2c;
    ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar1;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  return uVar2 != uVar3;
}

Assistant:

bool ON_DimStyle::Internal_SetColorMember(
  ON_DimStyle::field field_id,
  ON_Color value,
  ON_Color& class_member
)
{
  bool bValueChanged = false;
  if (value != class_member)
  {
    class_member = value;
    Internal_ContentChange();
    bValueChanged = true;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  return bValueChanged;
}